

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

aiNode * __thiscall Assimp::D3MF::XmlSerializer::ReadObject(XmlSerializer *this,aiScene *scene)

{
  _Head_base<0UL,_aiNode_*,_false> _Var1;
  pointer __first;
  pointer __last;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  aiNode *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  aiMesh *paVar5;
  uint *__result;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar6;
  unsigned_long uVar7;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  vector<unsigned_long,_std::allocator<unsigned_long>_> meshIds;
  aiMesh *mesh;
  string name;
  string type;
  _Head_base<0UL,_aiNode_*,_false> local_b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_88;
  unsigned_long local_80;
  aiMesh *local_78;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = local_60;
  local_68 = 0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_60[0] = 0;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_b0._M_head_impl = this_00;
  iVar4 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::id_abi_cxx11_);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    std::__cxx11::string::assign((char *)&local_70);
  }
  iVar4 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::type_abi_cxx11_);
  if (CONCAT44(extraout_var_00,iVar4) != 0) {
    std::__cxx11::string::assign((char *)&local_50);
  }
  uVar2 = local_68;
  _Var1._M_head_impl = local_b0._M_head_impl;
  (local_b0._M_head_impl)->mParent = scene->mRootNode;
  if (local_68 < 0x400) {
    ((local_b0._M_head_impl)->mName).length = (ai_uint32)local_68;
    memcpy(((local_b0._M_head_impl)->mName).data,local_70,local_68);
    ((_Var1._M_head_impl)->mName).data[uVar2] = '\0';
  }
  pvVar6 = &this->mMeshes;
  uVar7 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  while( true ) {
    bVar3 = ReadToEndElement(this,(string *)XmlTag::object_abi_cxx11_);
    __last = local_a8._M_impl.super__Vector_impl_data._M_finish;
    __first = local_a8._M_impl.super__Vector_impl_data._M_start;
    _Var1._M_head_impl = local_b0._M_head_impl;
    if (!bVar3) break;
    iVar4 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    bVar3 = std::operator==((char *)CONCAT44(extraout_var_01,iVar4),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            XmlTag::mesh_abi_cxx11_);
    if (bVar3) {
      paVar5 = ReadMesh(this);
      uVar2 = local_68;
      local_88 = pvVar6;
      local_78 = paVar5;
      if (local_68 < 0x400) {
        (paVar5->mName).length = (ai_uint32)local_68;
        memcpy((paVar5->mName).data,local_70,local_68);
        (paVar5->mName).data[uVar2] = '\0';
      }
      pvVar6 = local_88;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(local_88,&local_78);
      local_80 = uVar7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&local_80);
      uVar7 = uVar7 + 1;
    }
  }
  (local_b0._M_head_impl)->mNumMeshes =
       (uint)((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a8._M_impl.super__Vector_impl_data._M_start) >> 3);
  __result = (uint *)operator_new__((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish
                                           - (long)local_a8._M_impl.super__Vector_impl_data._M_start
                                           ) >> 1 & 0x3fffffffc);
  (_Var1._M_head_impl)->mMeshes = __result;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_long*,unsigned_int*>(__first,__last,__result);
  _Var1._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (aiNode *)0x0;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
            ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_b0);
  return _Var1._M_head_impl;
}

Assistant:

aiNode* ReadObject(aiScene* scene) {
        std::unique_ptr<aiNode> node(new aiNode());

        std::vector<unsigned long> meshIds;

        const char *attrib( nullptr );
        std::string name, type;
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::id.c_str() );
        if ( nullptr != attrib ) {
            name = attrib;
        }
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::type.c_str() );
        if ( nullptr != attrib ) {
            type = attrib;
        }

        node->mParent = scene->mRootNode;
        node->mName.Set(name);

        size_t meshIdx = mMeshes.size();

        while(ReadToEndElement(D3MF::XmlTag::object)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::mesh) {
                auto mesh = ReadMesh();

                mesh->mName.Set(name);
                mMeshes.push_back(mesh);
                meshIds.push_back(static_cast<unsigned long>(meshIdx));
                ++meshIdx;
            }
        }

        node->mNumMeshes = static_cast<unsigned int>(meshIds.size());

        node->mMeshes = new unsigned int[node->mNumMeshes];

        std::copy(meshIds.begin(), meshIds.end(), node->mMeshes);

        return node.release();
    }